

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

void __thiscall kratos::AssignStmt::set_parent(AssignStmt *this,IRNode *parent)

{
  Var *pVVar1;
  shared_ptr<kratos::AssignStmt> sVar2;
  undefined1 local_50 [32];
  undefined1 local_30 [31];
  bool has_parent;
  IRNode *parent_local;
  AssignStmt *this_local;
  
  local_30[0x17] = (this->super_Stmt).parent_ != (IRNode *)0x0;
  unique0x10000111 = parent;
  parent_local = (IRNode *)this;
  Stmt::set_parent(&this->super_Stmt,parent);
  if ((local_30[0x17] & 1) == 0) {
    pVVar1 = this->right_;
    sVar2 = Stmt::as<kratos::AssignStmt>((Stmt *)local_30);
    (*(pVVar1->super_IRNode)._vptr_IRNode[0x15])
              (pVVar1,(Stmt *)local_30,
               sVar2.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._M_pi);
    std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_30);
    if ((IRNode *)stack0xffffffffffffffe8 != (IRNode *)0x0) {
      pVVar1 = this->left_;
      sVar2 = Stmt::as<kratos::AssignStmt>((Stmt *)local_50);
      (*(pVVar1->super_IRNode)._vptr_IRNode[0x16])
                (pVVar1,(Stmt *)local_50,
                 sVar2.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._M_pi);
      std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_50);
    }
  }
  return;
}

Assistant:

void AssignStmt::set_parent(kratos::IRNode *parent) {
    bool has_parent = parent_ != nullptr;
    Stmt::set_parent(parent);
    // push the stmt into its sources
    if (!has_parent) {
        // if it has parent, it means we've already added the source and sink
        right_->add_sink(as<AssignStmt>());
        if (parent) left_->add_source(as<AssignStmt>());
    }
}